

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_test.cpp
# Opt level: O0

void __thiscall
biosoup::test::BiosoupTimerTest_Lap_Test::~BiosoupTimerTest_Lap_Test
          (BiosoupTimerTest_Lap_Test *this)

{
  BiosoupTimerTest_Lap_Test *this_local;
  
  ~BiosoupTimerTest_Lap_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(BiosoupTimerTest, Lap) {
  Timer t{};
  t.Start();
  EXPECT_TRUE(ExpectWithinInclusive(0, 0.001, t.Lap()));
  std::this_thread::sleep_for(std::chrono::milliseconds(256));
  EXPECT_TRUE(ExpectWithinInclusive(0.256, 0.384, t.Lap()));
  EXPECT_EQ(0, t.elapsed_time());
  EXPECT_TRUE(ExpectWithinInclusive(0.256, 0.384, t.Stop()));
  EXPECT_TRUE(ExpectWithinInclusive(0, 0.001, t.Lap()));
}